

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O0

void show_obj_list(olist_detail_t mode)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  wchar_t local_b4;
  wchar_t local_ac;
  wchar_t local_a4;
  wchar_t local_9c;
  wchar_t local_98;
  size_t local_90;
  char letter;
  char *fmt;
  wchar_t quiver_slots;
  wchar_t j;
  wchar_t count;
  _Bool terse;
  _Bool in_term;
  char tmp_val [80];
  wchar_t col;
  wchar_t row;
  wchar_t i;
  olist_detail_t mode_local;
  
  tmp_val[0x4c] = '\0';
  tmp_val[0x4d] = '\0';
  tmp_val[0x4e] = '\0';
  tmp_val[0x4f] = '\0';
  tmp_val[0x48] = '\0';
  tmp_val[0x49] = '\0';
  tmp_val[0x4a] = '\0';
  tmp_val[0x4b] = '\0';
  bVar4 = (mode & OLIST_WINDOW) != OLIST_NONE;
  max_len = 0;
  ex_width = L'\0';
  ex_offset = L'\0';
  row = mode;
  if ((bVar4) && (max_len = 0x28, Term->wid < 0x28)) {
    row = mode & ~OLIST_WEIGHT;
  }
  set_obj_names(Term->wid < 0x32,player);
  if (((row & 2U) != 0) && (*player->upkeep->quiver != (object *)0x0)) {
    if (max_len < 0x18) {
      local_90 = 0x18;
    }
    else {
      local_90 = max_len;
    }
    max_len = local_90;
  }
  if ((row & 8U) != 0) {
    ex_width = ex_width + L'\t';
  }
  if ((row & 0x10U) != 0) {
    ex_width = ex_width + L'\t';
  }
  if ((row & 0x20U) != 0) {
    ex_width = ex_width + L'\n';
  }
  local_98 = (wchar_t)max_len;
  if (bVar4) {
    tmp_val[0x4c] = '\0';
    tmp_val[0x4d] = '\0';
    tmp_val[0x4e] = '\0';
    tmp_val[0x4f] = '\0';
    tmp_val[0x48] = '\0';
    tmp_val[0x49] = '\0';
    tmp_val[0x4a] = '\0';
    tmp_val[0x4b] = '\0';
  }
  else {
    tmp_val[0x4c] = '\x01';
    tmp_val[0x4d] = '\0';
    tmp_val[0x4e] = '\0';
    tmp_val[0x4f] = '\0';
    tmp_val._72_4_ = ((Term->wid + -1) - local_98) - ex_width;
    if ((int)tmp_val._72_4_ < 3) {
      tmp_val[0x48] = '\0';
      tmp_val[0x49] = '\0';
      tmp_val[0x4a] = '\0';
      tmp_val[0x4b] = '\0';
    }
  }
  if ((ulong)(long)(((Term->wid + -1) - ex_width) - tmp_val._72_4_) < max_len) {
    local_98 = ((Term->wid + -1) - ex_width) - tmp_val._72_4_;
  }
  ex_offset = local_98;
  for (col = L'\0'; col < num_obj; col = col + L'\x01') {
    show_obj(col,tmp_val._76_4_,tmp_val._72_4_,false,row);
  }
  if ((row & 2U) != 0) {
    iVar2 = (player->upkeep->quiver_cnt + (uint)z_info->quiver_slot_size + -1) /
            (int)(uint)z_info->quiver_slot_size;
    for (fmt._4_4_ = 0; fmt._4_4_ < iVar2; fmt._4_4_ = fmt._4_4_ + 1) {
      if (bVar4) {
        local_9c = col + L'\xffffffff';
      }
      else {
        local_9c = col;
      }
      cVar1 = "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[local_9c];
      if (fmt._4_4_ == iVar2 + -1) {
        quiver_slots = player->upkeep->quiver_cnt - (uint)z_info->quiver_slot_size * (iVar2 + -1);
      }
      else {
        quiver_slots = (wchar_t)z_info->quiver_slot_size;
      }
      if (tmp_val._72_4_ + -2 < 0) {
        local_a4 = L'\0';
      }
      else {
        local_a4 = tmp_val._72_4_ + L'\xfffffffe';
      }
      prt("",tmp_val._76_4_ + col,local_a4);
      strnfmt((char *)&count,0x50,"%c) ",(ulong)(uint)(int)cVar1);
      c_put_str('\x02',(char *)&count,tmp_val._76_4_ + col,tmp_val._72_4_);
      pcVar3 = "s";
      if (quiver_slots == L'\x01') {
        pcVar3 = "";
      }
      strnfmt((char *)&count,0x50,"in Quiver: %d missile%s",(ulong)(uint)quiver_slots,pcVar3);
      c_put_str('\x0f',(char *)&count,tmp_val._76_4_ + col,tmp_val._72_4_ + L'\x03');
      col = col + L'\x01';
    }
  }
  if (bVar4) {
    for (; col < Term->hgt; col = col + L'\x01') {
      if (tmp_val._72_4_ + -2 < 0) {
        local_ac = L'\0';
      }
      else {
        local_ac = tmp_val._72_4_ + L'\xfffffffe';
      }
      prt("",tmp_val._76_4_ + col,local_ac);
    }
  }
  else if ((L'\0' < col) && (tmp_val._76_4_ + col < 0x18)) {
    if (tmp_val._72_4_ + -2 < 0) {
      local_b4 = L'\0';
    }
    else {
      local_b4 = tmp_val._72_4_ + L'\xfffffffe';
    }
    prt("",tmp_val._76_4_ + col,local_b4);
  }
  return;
}

Assistant:

static void show_obj_list(olist_detail_t mode)
{
	int i, row = 0, col = 0;
	char tmp_val[80];

	bool in_term = (mode & OLIST_WINDOW) ? true : false;
	bool terse = false;

	/* Initialize */
	max_len = 0;
	ex_width = 0;
	ex_offset = 0;

	if (in_term) max_len = 40;
	if (in_term && Term->wid < 40) mode &= ~(OLIST_WEIGHT);

	if (Term->wid < 50) terse = true;

	/* Set the names and get the max length */
	set_obj_names(terse, player);

	/* Take the quiver message into consideration */
	if (mode & OLIST_QUIVER && player->upkeep->quiver[0] != NULL)
		max_len = MAX(max_len, 24);

	/* Width of extra fields */
	if (mode & OLIST_WEIGHT) ex_width += 9;
	if (mode & OLIST_PRICE) ex_width += 9;
	if (mode & OLIST_FAIL) ex_width += 10;

	/* Determine beginning row and column */
	if (in_term) {
		/* Term window */
		row = 0;
		col = 0;
	} else {
		/* Main window */
		row = 1;
		col = Term->wid - 1 - max_len - ex_width;

		if (col < 3) col = 0;
	}

	/* Column offset of the first extra field */
	ex_offset = MIN(max_len, (size_t)(Term->wid - 1 - ex_width - col));

	/* Output the list */
	for (i = 0; i < num_obj; i++)
		show_obj(i, row, col, false, mode);

	/* For the inventory: print the quiver count */
	if (mode & OLIST_QUIVER) {
		int count, j;
		int quiver_slots = (player->upkeep->quiver_cnt + z_info->quiver_slot_size - 1) / z_info->quiver_slot_size;

		/* Quiver may take multiple lines */
		for (j = 0; j < quiver_slots; j++, i++) {
			const char *fmt = "in Quiver: %d missile%s";
			char letter = all_letters_nohjkl[in_term ? i - 1 : i];

			/* Number of missiles in this "slot" */
			if (j == quiver_slots - 1)
				count = player->upkeep->quiver_cnt - (z_info->quiver_slot_size * (quiver_slots - 1));
			else
				count = z_info->quiver_slot_size;

			/* Clear the line */
			prt("", row + i, MAX(col - 2, 0));

			/* Print the (disabled) label */
			strnfmt(tmp_val, sizeof(tmp_val), "%c) ", letter);
			c_put_str(COLOUR_SLATE, tmp_val, row + i, col);

			/* Print the count */
			strnfmt(tmp_val, sizeof(tmp_val), fmt, count,
					count == 1 ? "" : "s");
			c_put_str(COLOUR_L_UMBER, tmp_val, row + i, col + 3);
		}
	}

	/* Clear term windows */
	if (in_term) {
		for (; i < Term->hgt; i++)
			prt("", row + i, MAX(col - 2, 0));
	} else if (i > 0 && row + i < 24) {
		/* Print a drop shadow for the main window if necessary */
		prt("", row + i, MAX(col - 2, 0));
	}
}